

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusplatforminputcontext.cpp
# Opt level: O0

void __thiscall QIBusPlatformInputContext::cursorRectChanged(QIBusPlatformInputContext *this)

{
  bool bVar1;
  byte bVar2;
  QRect *pQVar3;
  long lVar4;
  QPoint QVar5;
  QPoint QVar6;
  QDebug *pQVar7;
  long in_RDI;
  long in_FS_OFFSET;
  char *t;
  QLatin1StringView QVar8;
  qreal scale;
  qreal scale_1;
  QWindow *inputWindow;
  QRect newRect;
  QPoint native;
  QPoint point;
  QRect screenGeometry;
  QRect newRect_1;
  QMargins margins;
  QRect r;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  QMessageLogger *in_stack_fffffffffffffe20;
  QPoint *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  char *in_stack_fffffffffffffe58;
  QDebug local_150;
  undefined1 local_148 [8];
  QDebug local_140;
  QSize local_138;
  QSize local_130;
  undefined8 local_128;
  undefined8 local_120;
  QPoint local_118;
  undefined8 in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  QDebug local_a8;
  undefined1 local_a0 [8];
  QDebug local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [56];
  QRect local_38;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)(in_RDI + 0x18) + 0x2a) & 1) != 0) {
    local_38.x2.m_i = -0x55555556;
    local_38.y2.m_i = -0x55555556;
    local_38.x1.m_i = -0x55555556;
    local_38.y1.m_i = -0x55555556;
    QCoreApplication::instance();
    QGuiApplication::inputMethod();
    QInputMethod::cursorRectangle();
    local_38 = QRectF::toRect((QRectF *)
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    bVar1 = QRect::isValid((QRect *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    if (bVar1) {
      QCoreApplication::instance();
      pQVar3 = (QRect *)QGuiApplication::focusWindow();
      if (pQVar3 != (QRect *)0x0) {
        lVar4 = QWindow::screen();
        if (lVar4 != 0) {
          QGuiApplication::platformName();
          QVar8 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
          bVar2 = QString::startsWith((QLatin1String *)local_70,(CaseSensitivity)QVar8.m_size);
          QString::~QString((QString *)0x11d90b);
          if ((bVar2 & 1) == 0) {
            QWindow::screen();
            QScreen::geometry();
            QRect::topLeft((QRect *)in_stack_fffffffffffffe08);
            QWindow::mapToGlobal((QPoint *)pQVar3);
            t = (char *)QWindow::devicePixelRatio();
            QVar5 = QRect::topLeft((QRect *)in_stack_fffffffffffffe08);
            QVar6 = operator-((QPoint *)pQVar3,
                              (QPoint *)
                              CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
            operator*((QPoint *)pQVar3,
                      (double)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
            local_118 = QRect::topLeft((QRect *)in_stack_fffffffffffffe08);
            operator+((QPoint *)pQVar3,
                      (QPoint *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
            local_128 = 0xaaaaaaaaaaaaaaaa;
            local_120 = 0xaaaaaaaaaaaaaaaa;
            local_138 = QRect::size(pQVar3);
            local_130 = operator*((QSize *)pQVar3,
                                  (qreal)CONCAT44(in_stack_fffffffffffffe1c,
                                                  in_stack_fffffffffffffe18));
            QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         in_stack_fffffffffffffe28,(QSize *)pQVar3);
            local_28 = 0xaaaaaaaaaaaaaaaa;
            local_20 = 0xaaaaaaaaaaaaaaaa;
            lcQpaInputMethods();
            anon_unknown.dwarf_801cf::QLoggingCategoryMacroHolder<(QtMsgType)0>::
            QLoggingCategoryMacroHolder
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       in_stack_fffffffffffffe08);
            while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                     ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
              anon_unknown.dwarf_801cf::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11ddac);
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)pQVar3,
                         (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         in_stack_fffffffffffffe14,(char *)in_stack_fffffffffffffe08,
                         (char *)0x11ddc5);
              QMessageLogger::debug();
              pQVar7 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffe28,t);
              QDebug::QDebug((QDebug *)local_148,pQVar7);
              ::operator<<((QDebug *)(local_148 + 8),(QRect *)local_148);
              QDebug::~QDebug((QDebug *)(local_148 + 8));
              QDebug::~QDebug((QDebug *)local_148);
              QDebug::~QDebug(&local_150);
              local_20 = local_20 & 0xffffffffffffff00;
            }
            pQVar3 = (QRect *)std::
                              unique_ptr<QIBusInputContextProxy,_std::default_delete<QIBusInputContextProxy>_>
                              ::operator->((unique_ptr<QIBusInputContextProxy,_std::default_delete<QIBusInputContextProxy>_>
                                            *)0x11de61);
            QRect::x((QRect *)0x11de72);
            QRect::y((QRect *)0x11de83);
            QRect::width(pQVar3);
            QRect::height(pQVar3);
            QIBusInputContextProxy::SetCursorLocation
                      ((QIBusInputContextProxy *)QVar8.m_data,QVar6.yp.m_i.m_i,QVar6.xp.m_i.m_i,
                       QVar5.yp.m_i.m_i,QVar5.xp.m_i.m_i);
            QDBusPendingReply<>::~QDBusPendingReply((QDBusPendingReply<> *)0x11ded3);
          }
          else {
            local_80._0_8_ = 0xaaaaaaaaaaaaaaaa;
            local_80._8_8_ = 0xaaaaaaaaaaaaaaaa;
            local_80 = QWindow::frameMargins();
            QMargins::left((QMargins *)0x11d95d);
            QMargins::top((QMargins *)0x11d96e);
            QRect::translate((QRect *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                             (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                             (int)in_stack_fffffffffffffe08);
            QWindow::devicePixelRatio();
            local_90 = 0xaaaaaaaaaaaaaaaa;
            local_88 = 0xaaaaaaaaaaaaaaaa;
            QRect::x((QRect *)0x11d9bc);
            QRect::y((QRect *)0x11d9db);
            QRect::width((QRect *)in_stack_fffffffffffffe08);
            QRect::height((QRect *)in_stack_fffffffffffffe08);
            QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,
                         (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                         (int)in_stack_fffffffffffffe08);
            local_18 = 0xaaaaaaaaaaaaaaaa;
            local_10 = 0xaaaaaaaaaaaaaaaa;
            lcQpaInputMethods();
            anon_unknown.dwarf_801cf::QLoggingCategoryMacroHolder<(QtMsgType)0>::
            QLoggingCategoryMacroHolder
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       in_stack_fffffffffffffe08);
            while( true ) {
              bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                ((QLoggingCategoryMacroHolder *)&local_18);
              if (!bVar1) break;
              anon_unknown.dwarf_801cf::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11da97);
              QMessageLogger::QMessageLogger
                        (in_stack_fffffffffffffe20,
                         (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         in_stack_fffffffffffffe14,(char *)in_stack_fffffffffffffe08,
                         (char *)0x11dab0);
              QMessageLogger::debug();
              pQVar7 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffe28,
                                          in_stack_fffffffffffffe58);
              QDebug::QDebug((QDebug *)local_a0,pQVar7);
              ::operator<<((QDebug *)(local_a0 + 8),(QRect *)local_a0);
              QDebug::~QDebug((QDebug *)(local_a0 + 8));
              QDebug::~QDebug((QDebug *)local_a0);
              QDebug::~QDebug(&local_a8);
              local_10 = local_10 & 0xffffffffffffff00;
            }
            std::unique_ptr<QIBusInputContextProxy,_std::default_delete<QIBusInputContextProxy>_>::
            operator->((unique_ptr<QIBusInputContextProxy,_std::default_delete<QIBusInputContextProxy>_>
                        *)0x11db4c);
            QRect::x((QRect *)0x11db5e);
            QRect::y((QRect *)0x11db6f);
            QRect::width((QRect *)in_stack_fffffffffffffe08);
            QRect::height((QRect *)in_stack_fffffffffffffe08);
            QIBusInputContextProxy::SetCursorLocationRelative
                      ((QIBusInputContextProxy *)QVar8.m_data,
                       (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                       (int)in_stack_fffffffffffffef8,
                       (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                       (int)in_stack_fffffffffffffef0);
            QDBusPendingReply<>::~QDBusPendingReply((QDBusPendingReply<> *)0x11dbc0);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIBusPlatformInputContext::cursorRectChanged()
{
    if (!d->busConnected)
        return;

    QRect r = qApp->inputMethod()->cursorRectangle().toRect();
    if (!r.isValid())
        return;

    QWindow *inputWindow = qApp->focusWindow();
    if (!inputWindow)
        return;
    if (!inputWindow->screen())
        return;

    if (QGuiApplication::platformName().startsWith("wayland"_L1)) {
        auto margins = inputWindow->frameMargins();
        r.translate(margins.left(), margins.top());
        qreal scale = inputWindow->devicePixelRatio();
        QRect newRect = QRect(r.x() * scale, r.y() * scale, r.width() * scale, r.height() * scale);
        qCDebug(lcQpaInputMethods) << "microFocus" << newRect;
        d->context->SetCursorLocationRelative(newRect.x(), newRect.y(),
                                              newRect.width(), newRect.height());
        return;
    }

    // x11/xcb
    auto screenGeometry = inputWindow->screen()->geometry();
    auto point = inputWindow->mapToGlobal(r.topLeft());
    qreal scale = inputWindow->devicePixelRatio();
    auto native = (point - screenGeometry.topLeft()) * scale + screenGeometry.topLeft();
    QRect newRect(native, r.size() * scale);
    qCDebug(lcQpaInputMethods) << "microFocus" << newRect;
    d->context->SetCursorLocation(newRect.x(), newRect.y(),
                                  newRect.width(), newRect.height());
}